

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O3

size_t __thiscall
axl::sl::Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::copyReverse
          (Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *this,wchar_t *p,size_t count)

{
  Hdr *dst;
  bool bVar1;
  size_t sVar2;
  Ptr<void> shadow;
  Ptr<void> local_48;
  Ptr<void> local_38;
  
  if (count == 0) {
    sVar2 = 0;
    setCountImpl<axl::sl::SimpleArrayDetails<wchar_t>::Construct>(this,0);
  }
  else {
    local_38.m_p = (void *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    dst = (this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_hdr;
    if (((dst != (Hdr *)0x0) && (dst + 1 <= p)) &&
       (p < (wchar_t *)((long)&dst[1].super_RefCount._vptr_RefCount + dst->m_bufferSize))) {
      local_48.m_p = (EVP_PKEY_CTX *)0x0;
      local_48.m_refCount = (RefCount *)0x0;
      rc::Ptr<void>::copy(&local_48,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)dst);
      rc::Ptr<void>::copy(&local_38,(EVP_PKEY_CTX *)local_48.m_p,(EVP_PKEY_CTX *)local_48.m_refCount
                         );
      rc::Ptr<void>::clear(&local_48);
    }
    bVar1 = setCountImpl<axl::sl::SimpleArrayDetails<wchar_t>::Construct>(this,count);
    sVar2 = 0xffffffffffffffff;
    if (bVar1) {
      ReverseArray<wchar_t>::copyReverse
                ((this->super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>).m_p,p,count);
      sVar2 = count;
    }
    rc::Ptr<void>::clear(&local_38);
  }
  return sVar2;
}

Assistant:

size_t
	copyReverse(
		const T* p,
		size_t count
	) {
		if (count == 0) {
			clear();
			return 0;
		}

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			shadow = this->m_hdr; // ensure we keep p intact

		bool result = setCount(count);
		if (!result)
			return -1;

		Details::copyReverse(this->m_p, p, count);
		return count;
	}